

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::RationalTangentialDistortion::transform
          (RationalTangentialDistortion *this,double *x,double *y,double xd,double yd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = xd * xd + yd * yd;
  dVar4 = dVar3 * dVar3;
  dVar2 = (dVar3 * dVar4 * this->kd[4] + dVar4 * this->kd[3] + dVar3 * this->kd[2] + 1.0) /
          (dVar3 * dVar4 * this->kd[7] + dVar4 * this->kd[6] + dVar3 * this->kd[5] + 1.0);
  dVar4 = this->kd[0];
  dVar1 = this->kd[1];
  *x = ((xd + xd) * xd + dVar3) * dVar1 + xd * dVar2 + (dVar4 + dVar4) * xd * yd;
  *y = (dVar1 + dVar1) * xd * yd + dVar2 * yd + ((yd + yd) * yd + dVar3) * dVar4;
  return;
}

Assistant:

void RationalTangentialDistortion::transform(double &x, double &y, double xd, double yd) const
{
  const double r2=xd*xd+yd*yd;
  const double r4=r2*r2;
  const double r6=r4*r2;

  const double s=(1.0 + kd[2]*r2 + kd[3]*r4 + kd[4]*r6) /
                 (1.0 + kd[5]*r2 + kd[6]*r4 + kd[7]*r6);

  const double xx=xd*s + 2*kd[0]*xd*yd      + kd[1]*(r2+2*xd*xd);
  const double yy=yd*s + kd[0]*(r2+2*yd*yd) + 2*kd[1]*xd*yd;

  x=xx;
  y=yy;
}